

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

void sysbvm_tuple_byteSlotAtPut
               (sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex,uint8_t value)

{
  uint uVar1;
  
  if ((tuple & 0xf) != 0 || tuple == 0) {
    sysbvm_error_modifyImmediateValue();
    if ((tuple & 0xf) != 0) {
      sysbvm_error_modifyImmutableTuple();
    }
    sysbvm_error("Expected a byte tuple.");
  }
  uVar1 = *(uint *)(tuple + 8);
  if ((char)uVar1 < '\0') {
    sysbvm_error_accessDummyValue();
    uVar1 = *(uint *)(tuple + 8);
  }
  if ((uVar1 & 0x300) != 0x200) {
    sysbvm_error("Expected a byte tuple.");
  }
  if (slotIndex < *(uint *)(tuple + 0xc)) {
    *(uint8_t *)(tuple + 0x10 + slotIndex) = value;
    return;
  }
  sysbvm_error_outOfBoundsSlotAccess();
  return;
}

Assistant:

SYSBVM_API void sysbvm_tuple_byteSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex, uint8_t value)
{
    (void)context;
    if(!sysbvm_tuple_isNonNullPointer(tuple)) sysbvm_error_modifyImmediateValue();
    if(sysbvm_tuple_isDummyValue(tuple)) sysbvm_error_accessDummyValue();
    if(sysbvm_tuple_isImmediate(tuple)) sysbvm_error_modifyImmutableTuple();

    if(!sysbvm_tuple_isBytes(tuple))
        sysbvm_error("Expected a byte tuple.");

    if(slotIndex < sysbvm_tuple_getSizeInBytes(tuple))
        SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes[slotIndex] = value;
    else
        sysbvm_error_outOfBoundsSlotAccess();
}